

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-attitude-trajectory-reconstruction.hxx
# Opt level: O0

examples * __thiscall
stateObservation::examples::imuAttitudeTrajectoryReconstruction
          (examples *this,IndexedMatrixArray *y,IndexedMatrixArray *u,Vector *xh0,Matrix *p,
          Matrix *q,Matrix *r,double dt)

{
  uint uVar1;
  uint uVar2;
  Matrix local_6e0;
  Type local_6c8;
  Type local_690;
  Vector3 local_658;
  Matrix<double,__1,_1,_0,__1,_1> local_640;
  undefined1 local_630 [8];
  Vector xhk;
  Matrix c;
  Matrix a;
  Matrix<double,__1,_1,_0,__1,_1> local_5d8;
  Matrix local_5c8;
  Matrix<double,__1,_1,_0,__1,_1> local_5b0;
  uint local_59c;
  undefined1 local_598 [4];
  uint i;
  undefined1 local_579;
  double local_578;
  Matrix<double,__1,_1,_0,__1,_1> local_570;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_560;
  undefined1 local_538 [8];
  Vector dx;
  Matrix<double,__1,_1,_0,__1,_1> local_510 [2];
  IMUDynamicalSystem local_4f0 [8];
  IMUDynamicalSystem imuFunctor;
  ExtendedKalmanFilter local_398 [8];
  ExtendedKalmanFilter filter;
  uint inputSize;
  uint measurementSize;
  uint stateSize;
  double dt_local;
  Matrix *q_local;
  Matrix *p_local;
  Vector *xh0_local;
  IndexedMatrixArray *u_local;
  IndexedMatrixArray *y_local;
  IndexedMatrixArray *xh;
  
  ExtendedKalmanFilter::ExtendedKalmanFilter(local_398,0x12,6,6,false,true);
  stateObservation::IMUDynamicalSystem::IMUDynamicalSystem(local_4f0);
  stateObservation::IMUDynamicalSystem::setSamplingPeriod(dt);
  stateObservation::ExtendedKalmanFilter::setFunctor((DynamicalSystemFunctorBase *)local_398);
  IndexedMatrixArray::getFirstIndex(y);
  stateObservation::ZeroDelayObserver::setState((Matrix *)local_398,(uint)xh0);
  stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)local_398);
  uVar1 = IndexedMatrixArray::getFirstIndex(y);
  IndexedMatrixArray::operator[]
            ((Matrix *)
             &dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,u,
             uVar1 - 1);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,_1,1,0,_1,1> *)local_510,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  IndexedMatrixArray::getFirstIndex(y);
  stateObservation::ZeroDelayObserver::setInput((Matrix *)local_398,(uint)local_510);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(local_510);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  stateObservation::KalmanFilterBase::setR((Matrix *)local_398);
  stateObservation::KalmanFilterBase::setQ((Matrix *)local_398);
  stateObservation::ObserverBase::stateVectorConstant(1.0);
  local_578 = 1e-08;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_560,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_570,&local_578);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_538,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_560);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_570);
  local_579 = 0;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)this);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_598,
             (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xh0);
  uVar1 = IndexedMatrixArray::getFirstIndex(y);
  IndexedMatrixArray::setValue((IndexedMatrixArray *)this,(Matrix *)local_598,uVar1 - 1);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_598);
  for (local_59c = IndexedMatrixArray::getFirstIndex(y); uVar1 = local_59c,
      uVar2 = IndexedMatrixArray::getLastIndex(y), uVar1 <= uVar2; local_59c = local_59c + 1) {
    IndexedMatrixArray::operator[](&local_5c8,y,local_59c);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_5b0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5c8);
    stateObservation::ZeroDelayObserver::setMeasurement((Matrix *)local_398,(uint)&local_5b0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_5b0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_5c8);
    uVar1 = local_59c;
    uVar2 = IndexedMatrixArray::getLastIndex(y);
    if (uVar1 < uVar2) {
      IndexedMatrixArray::operator[]
                ((Matrix *)
                 &a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,u,local_59c);
      Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_5d8,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 &a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols);
      stateObservation::ZeroDelayObserver::setInput((Matrix *)local_398,(uint)&local_5d8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_5d8);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)
                 &a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols);
    }
    stateObservation::ExtendedKalmanFilter::getAMatrixFD
              ((Matrix *)
               &c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
    stateObservation::ExtendedKalmanFilter::getCMatrixFD
              ((Matrix *)
               &xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    stateObservation::KalmanFilterBase::setA((Matrix *)local_398);
    stateObservation::KalmanFilterBase::setC((Matrix *)local_398);
    stateObservation::ZeroDelayObserver::getEstimatedState((uint)local_630);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_690,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_630,3,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,3,1,0,3,1> *)&local_658,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_690);
    kine::regulateOrientationVector((kine *)&local_640,&local_658);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_6c8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_630,3,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_6c8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_640);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_640);
    stateObservation::ZeroDelayObserver::setState((Matrix *)local_398,(uint)local_630);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_6e0,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_630);
    IndexedMatrixArray::setValue((IndexedMatrixArray *)this,&local_6e0,local_59c);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_6e0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_630);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
  }
  local_579 = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_538);
  stateObservation::IMUDynamicalSystem::~IMUDynamicalSystem(local_4f0);
  ExtendedKalmanFilter::~ExtendedKalmanFilter(local_398);
  return this;
}

Assistant:

IndexedMatrixArray imuAttitudeTrajectoryReconstruction
    (
    const IndexedMatrixArray & y,
    const IndexedMatrixArray & u,
    const Vector & xh0,
    const Matrix & p,
    const Matrix & q,
    const Matrix & r,
    double dt)
{
    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=6;

    ///initialization of the extended Kalman filter
    ExtendedKalmanFilter filter(stateSize, measurementSize, inputSize, false);

    ///initalization of the functor
    IMUDynamicalSystem imuFunctor;
    imuFunctor.setSamplingPeriod(dt);
    filter.setFunctor(& imuFunctor);

    ///the initalization of the estimation of the initial state
    filter.setState(xh0,y.getFirstIndex()-1);

    ///computation and initialization of the covariance matrix of the initial state
    filter.setStateCovariance(p);

    ///set initial input
    filter.setInput(u[y.getFirstIndex()-1],y.getFirstIndex()-1);

    ///The covariance matrix of the process noise and the measurement noise
    /// for the extended Kalman filter
    filter.setR(r);
    filter.setQ(q);

    ///set the derivation step for the finite difference method
    Vector dx=filter.stateVectorConstant(1)*1e-8;

    ///the array of the state estimations over time
    IndexedMatrixArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (unsigned i=y.getFirstIndex();i<=y.getLastIndex();++i)
    {
        ///introduction of the measurement
        filter.setMeasurement(y[i],i);

        ///introduction of the input
        if (i<y.getLastIndex())
            filter.setInput(u[i],i);

        ///get the jacobians by finite differences and provide
        ///them to the Kalman filter
        Matrix a=filter.getAMatrixFD(dx);
        Matrix c= filter.getCMatrixFD(dx);
        filter.setA(a);
        filter.setC(c);

        ///get the estimation and give it to the array
        Vector xhk=filter.getEstimatedState(i);

        ///regulate the part of orientation vector in the state vector
        xhk.segment(kine::ori,3)=kine::regulateOrientationVector
                                                    (xhk.segment(kine::ori,3));

        ///give the new value of the state to the kalman filter.
        ///This step is usually unnecessary, unless we modify the
        ///value of the state esimation which is the case here.
        filter.setState(xhk,i);

        xh.setValue(xhk,i);
    }

    return xh;
}